

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

void CivetServer::urlDecode(char *src,size_t src_len,string *dst,bool is_form_url_encoded)

{
  reference dst_00;
  size_type sVar1;
  out_of_range *this;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_70;
  char *local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  int local_58;
  int r;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> buf;
  bool is_form_url_encoded_local;
  string *dst_local;
  size_t src_len_local;
  char *src_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = is_form_url_encoded;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,src_len + 1,&local_41);
  std::allocator<char>::~allocator(&local_41);
  dst_local._0_4_ = (int)src_len;
  dst_00 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
  sVar1 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_40);
  local_58 = mg_url_decode(src,(int)dst_local,dst_00,(int)sVar1,
                           (byte)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_
                           & 1);
  if (local_58 < 0) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  local_60._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_40);
  local_70._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_40);
  local_68 = (char *)__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator+(&local_70,(long)local_58);
  std::__cxx11::string::
  assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)dst,local_60,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_68);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return;
}

Assistant:

void
CivetServer::urlDecode(const char *src,
                       size_t src_len,
                       std::string &dst,
                       bool is_form_url_encoded)
{
	// assign enough buffer
	std::vector<char> buf(src_len + 1);
	int r = mg_url_decode(src,
	                      static_cast<int>(src_len),
	                      &buf[0],
	                      static_cast<int>(buf.size()),
	                      is_form_url_encoded);
	if (r < 0) {
		// never reach here
		throw std::out_of_range("");
	}
	// dst can contain NUL characters
	dst.assign(buf.begin(), buf.begin() + r);
}